

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_slot.h
# Opt level: O1

unsigned_short __thiscall Am_Constraint_Iterator::Length(Am_Constraint_Iterator *this)

{
  Am_Slot_Data *pAVar1;
  unsigned_short uVar2;
  CItem *pCVar3;
  
  pAVar1 = (this->context).data;
  if (pAVar1 == (Am_Slot_Data *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    for (pCVar3 = (pAVar1->constraints).head; pCVar3 != (CItem *)0x0; pCVar3 = pCVar3->next) {
      uVar2 = uVar2 + 1;
    }
  }
  return uVar2;
}

Assistant:

operator Am_Slot_Data *() const { return data; }